

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11EglPlatform.cpp
# Opt level: O0

NativeWindow * __thiscall
tcu::x11::egl::WindowFactory::createWindow
          (WindowFactory *this,NativeDisplay *nativeDisplay,WindowParams *params)

{
  Window *this_00;
  Display *local_48;
  Display *display;
  WindowParams *params_local;
  NativeDisplay *nativeDisplay_local;
  WindowFactory *this_local;
  
  if (nativeDisplay == (NativeDisplay *)0x0) {
    local_48 = (Display *)0x0;
  }
  else {
    local_48 = (Display *)
               __dynamic_cast(nativeDisplay,&eglu::NativeDisplay::typeinfo,&Display::typeinfo,0);
  }
  this_00 = (Window *)operator_new(0x38);
  Window::Window(this_00,local_48,params,(Visual *)0x0);
  return &this_00->super_NativeWindow;
}

Assistant:

NativeWindow* WindowFactory::createWindow (NativeDisplay*		nativeDisplay,
										   const WindowParams&	params) const
{
	Display&	display	= *dynamic_cast<Display*>(nativeDisplay);

	return new Window(display, params, DE_NULL);
}